

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined1 local_23 [8];
  OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) && (R0 < 0x100)) &&
     ((R1 < 0x100 && (R2 < 0x100)))) {
    bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                  ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                  "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
    if ((ushort)(op - StartCall) < 0xfff8) {
      puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
      *puVar1 = *puVar1 + 1;
    }
    ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
    ByteCodeWriter::Data::Write(this_00,local_23,3);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg3(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2)
    {
        OpLayoutT_AsmReg3<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }